

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O1

uint strnshash(char *s)

{
  uint uVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char cVar4;
  
  cVar4 = *s;
  if (cVar4 == '\0') {
    uVar1 = 0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    pcVar3 = s + 1;
    uVar1 = 0;
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)cVar4 * 2 + 1) & 0x20) == 0) {
        uVar1 = uVar1 * 0x1f + (int)cVar4;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
  }
  return uVar1;
}

Assistant:

unsigned int strnshash(const char *s)
{
unsigned int	h = 0;

    while (*s) {
	if (!isspace(*s))
	    h = (h<<5) - h + *s;
	s++; }
    return h;
}